

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

QFileSystemEntry * __thiscall
QFileSystemEngine::getLinkTarget
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEngine *this,QFileSystemEntry *link,
          QFileSystemMetaData *data)

{
  Data *pDVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  void *pvVar6;
  int *piVar7;
  char *path;
  long lVar8;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDir parent;
  QString local_108;
  QString local_f0;
  QString local_d8;
  QByteArray local_b8;
  QFileSystemEntry local_98;
  QStringBuilder<QString,_char16_t> local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QFileSystemEntry::isEmpty((QFileSystemEntry *)this);
  if (bVar5) {
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,(QFileSystemEntry *)this);
      return __return_storage_ptr__;
    }
  }
  else {
    QFileSystemEntry::nativeFilePath((NativePath *)&local_98,(QFileSystemEntry *)this);
    pcVar2 = local_98.m_filePath.d.ptr;
    if (((QFileSystemMetaData *)local_98.m_filePath.d.size == (QFileSystemMetaData *)0x0) ||
       (pvVar6 = memchr(local_98.m_filePath.d.ptr,0,local_98.m_filePath.d.size),
       pvVar6 == (void *)0x0)) {
      lVar8 = -1;
    }
    else {
      lVar8 = (long)pvVar6 - (long)pcVar2;
    }
    if (&(local_98.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_98.m_filePath.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (lVar8 == -1) {
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::nativeFilePath((NativePath *)&local_98,(QFileSystemEntry *)this);
      path = (char *)local_98.m_filePath.d.ptr;
      if (local_98.m_filePath.d.ptr == (char16_t *)0x0) {
        path = "";
      }
      qt_readlink(&local_b8,path);
      if (&(local_98.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_98.m_filePath.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((QString *)local_b8.d.size == (QString *)0x0) {
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__);
      }
      else {
        local_d8.d.d = (Data *)0x0;
        local_d8.d.ptr = (char16_t *)0x0;
        local_d8.d.size = 0;
        if (((ulong)(link->m_filePath).d.d & 0x40000) == 0) {
          fillMetaData((QFileSystemEntry *)this,(QFileSystemMetaData *)link,(MetaDataFlags)0x40000);
        }
        if (((ulong)(link->m_filePath).d.d & 0x4000000000000) != 0) {
          if ((&(local_b8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QByteArray::reallocData(&local_b8,local_b8.d.size,KeepSize);
          }
          if (*local_b8.d.ptr != '/') {
            local_58.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            QFileSystemEntry::filePath(&local_98.m_filePath,(QFileSystemEntry *)this);
            QDir::QDir((QDir *)&local_58,&local_98.m_filePath);
            if (&(local_98.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_98.m_filePath.d.d)->super_QArrayData,2,0x10);
              }
            }
            QDir::cdUp((QDir *)&local_58);
            QDir::path(&local_98.m_filePath,(QDir *)&local_58);
            data = (QFileSystemMetaData *)local_98.m_filePath.d.size;
            pDVar3 = local_98.m_filePath.d.d;
            pcVar2 = local_d8.d.ptr;
            pDVar1 = local_d8.d.d;
            local_98.m_filePath.d.d = local_d8.d.d;
            local_d8.d.d = pDVar3;
            local_d8.d.ptr = local_98.m_filePath.d.ptr;
            local_98.m_filePath.d.ptr = pcVar2;
            local_98.m_filePath.d.size = local_d8.d.size;
            local_d8.d.size = (qsizetype)data;
            if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
              }
            }
            if (((QFileSystemMetaData *)local_d8.d.size != (QFileSystemMetaData *)0x0) &&
               (bVar5 = QString::endsWith(&local_d8,(QChar)0x2f,CaseSensitive), !bVar5)) {
              QString::append(&local_d8,(QChar)0x2f);
            }
            QDir::~QDir((QDir *)&local_58);
          }
        }
        ba.m_data = (storage_type *)data;
        ba.m_size = (qsizetype)local_b8.d.ptr;
        QString::fromLocal8Bit(&local_98.m_filePath,(QString *)local_b8.d.size,ba);
        QString::append(&local_d8,&local_98.m_filePath);
        if (&(local_98.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               = ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_filePath.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar5 = QString::startsWith(&local_d8,(QChar)0x2f,CaseSensitive);
        if (!bVar5) {
          absoluteName(&local_98,(QFileSystemEntry *)this);
          QFileSystemEntry::path(&local_108,&local_98);
          local_58.a.d.size = local_108.d.size;
          local_58.a.d.ptr = local_108.d.ptr;
          local_58.a.d.d = local_108.d.d;
          local_108.d.d = (Data *)0x0;
          local_108.d.ptr = (char16_t *)0x0;
          local_108.d.size = 0;
          local_58.b = L'/';
          QStringBuilder<QString,_char16_t>::convertTo<QString>(&local_f0,&local_58);
          if ((QChar *)local_f0.d.ptr == (QChar *)0x0) {
            local_f0.d.ptr = L"";
          }
          QString::insert(&local_d8,0,(QChar *)local_f0.d.ptr,local_f0.d.size);
          if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_98.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_98.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                ._M_i == 0) {
              QArrayData::deallocate(&(local_98.m_filePath.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        QDir::cleanPath(&local_98.m_filePath,&local_d8);
        qVar4 = local_98.m_filePath.d.size;
        pDVar3 = local_98.m_filePath.d.d;
        pcVar2 = local_d8.d.ptr;
        pDVar1 = local_d8.d.d;
        local_98.m_filePath.d.d = local_d8.d.d;
        local_d8.d.d = pDVar3;
        local_d8.d.ptr = local_98.m_filePath.d.ptr;
        local_98.m_filePath.d.ptr = pcVar2;
        local_98.m_filePath.d.size = local_d8.d.size;
        local_d8.d.size = qVar4;
        if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
          }
        }
        if (((QFileSystemMetaData *)0x1 < (ulong)local_d8.d.size) &&
           (bVar5 = QString::endsWith(&local_d8,(QChar)0x2f,CaseSensitive), bVar5)) {
          QString::chop(&local_d8,1);
        }
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_d8);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0x16;
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,(QFileSystemEntry *)this);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::getLinkTarget(const QFileSystemEntry &link, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(link, link);

    QByteArray s = qt_readlink(link.nativeFilePath().constData());
    if (s.size() > 0) {
        QString ret;
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            fillMetaData(link, data, QFileSystemMetaData::DirectoryType);
        if (data.isDirectory() && s[0] != '/') {
            QDir parent(link.filePath());
            parent.cdUp();
            ret = parent.path();
            if (!ret.isEmpty() && !ret.endsWith(u'/'))
                ret += u'/';
        }
        ret += QFile::decodeName(s);

        if (!ret.startsWith(u'/'))
            ret.prepend(absoluteName(link).path() + u'/');
        ret = QDir::cleanPath(ret);
        if (ret.size() > 1 && ret.endsWith(u'/'))
            ret.chop(1);
        return QFileSystemEntry(ret);
    }
#if defined(Q_OS_DARWIN)
    {
        QCFString path = CFStringCreateWithFileSystemRepresentation(0,
            QFile::encodeName(QDir::cleanPath(link.filePath())).data());
        if (!path)
            return QFileSystemEntry();

        QCFType<CFURLRef> url = CFURLCreateWithFileSystemPath(0, path, kCFURLPOSIXPathStyle,
            data.hasFlags(QFileSystemMetaData::DirectoryType));
        if (!url)
            return QFileSystemEntry();

        QCFType<CFDataRef> bookmarkData = CFURLCreateBookmarkDataFromFile(0, url, NULL);
        if (!bookmarkData)
            return QFileSystemEntry();

        QCFType<CFURLRef> resolvedUrl = CFURLCreateByResolvingBookmarkData(0,
            bookmarkData,
            (CFURLBookmarkResolutionOptions)(kCFBookmarkResolutionWithoutUIMask
                | kCFBookmarkResolutionWithoutMountingMask), NULL, NULL, NULL, NULL);
        if (!resolvedUrl)
            return QFileSystemEntry();

        QCFString cfstr(CFURLCopyFileSystemPath(resolvedUrl, kCFURLPOSIXPathStyle));
        if (!cfstr)
            return QFileSystemEntry();

        return QFileSystemEntry(QString::fromCFString(cfstr));
    }
#endif
    return QFileSystemEntry();
}